

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

int32_t decShiftToMost(uint8_t *uar,int32_t digits,int32_t shift)

{
  int iVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  
  uVar9 = (ulong)(uint)digits;
  if (shift == 0) {
    return digits;
  }
  uVar10 = shift + digits;
  if ((int)uVar10 < 2) {
    *uar = *uar * (char)DECPOWERS[shift];
    return uVar10;
  }
  if (digits < 0x32) {
    uVar9 = (ulong)""[digits];
  }
  uVar8 = shift;
  if (shift < 0x32) {
    uVar8 = (uint)""[shift];
  }
  pbVar6 = uar + (uVar9 - 1);
  uVar14 = shift;
  if (shift < 0x32) {
    uVar14 = (uint)""[shift];
  }
  pbVar7 = pbVar6 + uVar8;
  iVar1 = (shift - uVar14) + 1;
  if (iVar1 == 1) {
    if (pbVar6 < uar) goto LAB_00255a99;
    do {
      pbVar6[uVar8] = *pbVar6;
      pbVar6 = pbVar6 + -1;
    } while (uar <= pbVar6);
    iVar11 = 0;
  }
  else {
    uVar13 = uVar10;
    if ((int)uVar10 < 0x32) {
      uVar13 = (uint)""[uVar10];
    }
    iVar11 = 0;
    iVar12 = 0;
    if (pbVar6 < uar) goto LAB_00255a9c;
    iVar12 = -(shift - uVar14);
    uVar3 = multies[iVar12];
    uVar4 = DECPOWERS[iVar12];
    uVar5 = DECPOWERS[iVar1];
    do {
      bVar2 = *pbVar6;
      uVar14 = (bVar2 >> ((byte)iVar12 & 0x1f)) * uVar3 >> 0x11;
      if (pbVar6 + uVar8 <= uar + ((ulong)uVar13 - 1)) {
        pbVar6[uVar8] = (char)iVar11 + (char)uVar14;
      }
      iVar11 = ((uint)bVar2 - uVar14 * uVar4) * uVar5;
      pbVar6 = pbVar6 + -1;
    } while (uar <= pbVar6);
  }
  pbVar7 = pbVar6 + uVar8;
  iVar12 = iVar11;
LAB_00255a9c:
  while (uar <= pbVar7) {
    *pbVar7 = (byte)iVar12;
    pbVar7 = pbVar7 + -1;
LAB_00255a99:
    iVar12 = 0;
  }
  return uVar10;
}

Assistant:

static Int decShiftToMost(Unit *uar, Int digits, Int shift) {
  Unit  *target, *source, *first;  /* work  */
  Int   cut;                       /* odd 0's to add  */
  uInt  next;                      /* work  */

  if (shift==0) return digits;     /* [fastpath] nothing to do  */
  if ((digits+shift)<=DECDPUN) {   /* [fastpath] single-unit case  */
    *uar=(Unit)(*uar*powers[shift]);
    return digits+shift;
    }

  next=0;                          /* all paths  */
  source=uar+D2U(digits)-1;        /* where msu comes from  */
  target=source+D2U(shift);        /* where upper part of first cut goes  */
  cut=DECDPUN-MSUDIGITS(shift);    /* where to slice  */
  if (cut==0) {                    /* unit-boundary case  */
    for (; source>=uar; source--, target--) *target=*source;
    }
   else {
    first=uar+D2U(digits+shift)-1; /* where msu of source will end up  */
    for (; source>=uar; source--, target--) {
      /* split the source Unit and accumulate remainder for next  */
      #if DECDPUN<=4
        uInt quot=QUOT10(*source, cut);
        uInt rem=*source-quot*powers[cut];
        next+=quot;
      #else
        uInt rem=*source%powers[cut];
        next+=*source/powers[cut];
      #endif
      if (target<=first) *target=(Unit)next;   /* write to target iff valid  */
      next=rem*powers[DECDPUN-cut];            /* save remainder for next Unit  */
      }
    } /* shift-move  */

  /* propagate any partial unit to one below and clear the rest  */
  for (; target>=uar; target--) {
    *target=(Unit)next;
    next=0;
    }
  return digits+shift;
  }